

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_tessellation.cpp
# Opt level: O1

bool dxil_spv::emit_domain_location_instruction(Impl *impl,CallInst *instruction)

{
  Id IVar1;
  Id IVar2;
  Builder *this;
  Operation *pOVar3;
  Value *value;
  
  this = Converter::Impl::builder(impl);
  IVar1 = SPIRVModule::get_builtin_shader_input(impl->spirv_module,BuiltInTessCoord);
  IVar2 = spv::Builder::makeFloatType(this,0x20);
  IVar2 = spv::Builder::makePointer(this,StorageClassInput,IVar2);
  pOVar3 = Converter::Impl::allocate(impl,OpAccessChain,IVar2);
  Operation::add_id(pOVar3,IVar1);
  value = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
  IVar1 = Converter::Impl::get_id_for_value(impl,value,0x20);
  Operation::add_id(pOVar3,IVar1);
  Converter::Impl::add(impl,pOVar3,false);
  IVar1 = pOVar3->id;
  pOVar3 = Converter::Impl::allocate(impl,OpLoad,(Value *)instruction);
  Operation::add_id(pOVar3,IVar1);
  Converter::Impl::add(impl,pOVar3,false);
  return true;
}

Assistant:

bool emit_domain_location_instruction(Converter::Impl &impl, const llvm::CallInst *instruction)
{
	auto &builder = impl.builder();
	spv::Id tess_coord_id = impl.spirv_module.get_builtin_shader_input(spv::BuiltInTessCoord);

	auto *op =
	    impl.allocate(spv::OpAccessChain, builder.makePointer(spv::StorageClassInput, builder.makeFloatType(32)));
	op->add_id(tess_coord_id);
	op->add_id(impl.get_id_for_value(instruction->getOperand(1), 32));
	impl.add(op);
	tess_coord_id = op->id;

	op = impl.allocate(spv::OpLoad, instruction);
	op->add_id(tess_coord_id);
	impl.add(op);

	return true;
}